

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libmeshb7.c
# Opt level: O1

int64_t GetPos(GmfMshSct *msh)

{
  int64_t pos;
  int IntVal;
  long local_18;
  int local_c;
  
  if (msh->ver < 3) {
    ScaWrd(msh,&local_c);
    local_18 = (long)local_c;
  }
  else {
    ScaDblWrd(msh,&local_18);
  }
  return local_18;
}

Assistant:

static int64_t GetPos(GmfMshSct *msh)
{
   int      IntVal;
   int64_t  pos;

   if(msh->ver >= 3)
      ScaDblWrd(msh, (unsigned char*)&pos);
   else
   {
      ScaWrd(msh, (unsigned char*)&IntVal);
      pos = (int64_t)IntVal;
   }

   return(pos);
}